

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmChkCmp2<(moira::Instr)145,(moira::Mode)9,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  Ea<(moira::Mode)9,_4> src;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar6 = (*this->_vptr_Moira[6])();
  local_40 = op & 7;
  local_44 = *addr;
  *addr = local_44 + 2;
  local_3c = (*this->_vptr_Moira[6])(this);
  local_3c = local_3c & 0xffff;
  if (((uVar6 & 0x7ff) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)145,(moira::Mode)9,4>(this,str,addr,op);
    return;
  }
  cVar5 = 'c';
  lVar7 = 0;
  if (((uVar6 & 0xffff) >> 0xb & 1) == 0) {
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "cmp2"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = 'l';
    }
    else {
      cVar5 = '.';
      lVar7 = 0;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = "$%x.l"[lVar7 + 4];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar2 = (str->tab).raw;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      } while (str->ptr < str->base + iVar2);
      goto LAB_00373d5f;
    }
  }
  else {
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "chk2"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = 'l';
    }
    else {
      cVar5 = '.';
      lVar7 = 0;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar5;
        cVar5 = "$%x.l"[lVar7 + 4];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar2 = (str->tab).raw;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      } while (str->ptr < str->base + iVar2);
      goto LAB_00373d5f;
    }
  }
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ' ';
LAB_00373d5f:
  StrWriter::operator<<(str,(Ea<(moira::Mode)9,_4> *)&local_44);
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,(Rn)((uVar6 & 0xffff) >> 0xc));
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar5 = ';';
    lVar7 = 1;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "trap%-2s  ; (2+)"[lVar7 + 10];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmChkCmp2(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Rn       ( xxxx____________(ext)      );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {
            
            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    if (ext & 0x0800) {
        str << Ins<Instr::CHK2>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    } else {
        str << Ins<Instr::CMP2>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    }
    str << Av<I, M, S>{};
}